

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::insert
          (SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U> *this,TypeBase **key,
          FunctionData **value)

{
  uint uVar1;
  Node *pNVar2;
  Node *item;
  uint i;
  uint local_24;
  uint bucket;
  uint bucketMask;
  FunctionData **value_local;
  TypeBase **key_local;
  SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U> *this_local;
  
  _bucket = value;
  value_local = (FunctionData **)key;
  key_local = (TypeBase **)this;
  if (*key == (TypeBase *)0x0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<TypeBase *, FunctionData *, TypeBaseHasher, 32>::insert(const Key &, const Value &) [Key = TypeBase *, Value = FunctionData *, Hasher = TypeBaseHasher, N = 32]"
                 );
  }
  if (this->bucketCount <= this->count + (this->count >> 2)) {
    rehash(this);
  }
  local_24 = this->bucketCount - 1;
  uVar1 = TypeBaseHasher::operator()((TypeBaseHasher *)((long)&item + 7),(TypeBase *)*value_local);
  item._0_4_ = 0;
  while( true ) {
    i = uVar1 & local_24;
    if (this->bucketCount <= (uint)item) {
      __assert_fail("!\"couldn\'t insert node\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                    ,0x5b,
                    "void SmallDenseMap<TypeBase *, FunctionData *, TypeBaseHasher, 32>::insert(const Key &, const Value &) [Key = TypeBase *, Value = FunctionData *, Hasher = TypeBaseHasher, N = 32]"
                   );
    }
    pNVar2 = this->data + i;
    if (pNVar2->key == (TypeBase *)0x0) break;
    if ((FunctionData *)pNVar2->key == *value_local) {
      pNVar2->value = *_bucket;
      return;
    }
    uVar1 = i + (uint)item + 1;
    item._0_4_ = (uint)item + 1;
  }
  pNVar2->key = (TypeBase *)*value_local;
  pNVar2->value = *_bucket;
  this->count = this->count + 1;
  return;
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}